

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:731:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  ostringstream *this;
  Connection *this_00;
  OutputWorker *this_01;
  ErrorResult *pEVar2;
  long lVar3;
  Result local_1e0;
  type handler;
  ptr local_1b8;
  LogStringBuffer local_1a0;
  
  local_1b8.h = &handler;
  handler.error._M_cat = *(error_category **)&base[1].task_result_;
  handler.this = (Connection *)base[1].next_;
  handler.error._0_8_ = base[1].func_;
  local_1b8.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:731:27)>
                 *)base;
  local_1b8.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:731:27)>
                 *)base;
  ptr::reset(&local_1b8);
  this_00 = handler.this;
  if (owner != (void *)0x0) {
    if ((((handler.this)->ResolverState)._M_t.
         super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
         ._M_t.
         super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
         .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl ==
         (HostnameResolverState *)0x0) ||
       ((((handler.this)->ConnectionEstablished)._M_base._M_i & 1U) != 0)) {
      (**(code **)(*(long *)handler.error._M_cat + 0x20))
                (&local_1a0,handler.error._M_cat,handler.error._0_8_ & 0xffffffff);
      lVar3 = (long)handler.error._M_value;
      pEVar2 = (ErrorResult *)operator_new(0x38);
      pEVar2->Source = "Connection::OnICMPError";
      std::__cxx11::string::string((string *)&pEVar2->Description,(string *)&local_1a0);
      pEVar2->Type = Asio;
      pEVar2->Code = lVar3;
      local_1e0.Error = pEVar2;
      tonk::RefCounter::StartShutdown(&(this_00->super_IConnection).SelfRefCount,6,&local_1e0);
      tonk::Result::~Result(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    else {
      if ((int)((handler.this)->Logger).ChannelMinLevel < 2) {
        local_1a0.ChannelName = ((handler.this)->Logger).ChannelName;
        this = &local_1a0.LogStream;
        local_1a0.LogLevel = Debug;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,(string *)&(this_00->Logger).Prefix);
        std::operator<<((ostream *)this,"Selecting next server to connect to");
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_1a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
      }
      tonk::Connection::startConnectingToNextAddress(this_00);
    }
    LOCK();
    paVar1 = &(this_00->super_IConnection).SelfRefCount.RefCount;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
  }
  ptr::~ptr(&local_1b8);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }